

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O0

void duckdb::AggregateExecutor::
     Combine<duckdb::ArgMinMaxState<duckdb::timestamp_t,int>,duckdb::ArgMinMaxBase<duckdb::LessThan,true>>
               (Vector *source,Vector *target,AggregateInputData *aggr_input_data,idx_t count)

{
  ArgMinMaxState<duckdb::timestamp_t,_int> *source_00;
  ArgMinMaxState<duckdb::timestamp_t,_int> *in_RCX;
  idx_t i;
  ArgMinMaxState<duckdb::timestamp_t,_int> **tdata;
  ArgMinMaxState<duckdb::timestamp_t,_int> **sdata;
  ArgMinMaxState<duckdb::timestamp_t,_int> *target_00;
  
  FlatVector::GetData<duckdb::ArgMinMaxState<duckdb::timestamp_t,int>const*>((Vector *)0x887492);
  source_00 = (ArgMinMaxState<duckdb::timestamp_t,_int> *)
              FlatVector::GetData<duckdb::ArgMinMaxState<duckdb::timestamp_t,int>*>
                        ((Vector *)0x8874a1);
  for (target_00 = (ArgMinMaxState<duckdb::timestamp_t,_int> *)0x0; target_00 < in_RCX;
      target_00 = (ArgMinMaxState<duckdb::timestamp_t,_int> *)
                  &(target_00->super_ArgMinMaxStateBase).arg_null) {
    ArgMinMaxBase<duckdb::LessThan,true>::
    Combine<duckdb::ArgMinMaxState<duckdb::timestamp_t,int>,duckdb::ArgMinMaxBase<duckdb::LessThan,true>>
              (source_00,target_00,(AggregateInputData *)0x8874dd);
  }
  return;
}

Assistant:

static void Combine(Vector &source, Vector &target, AggregateInputData &aggr_input_data, idx_t count) {
		D_ASSERT(source.GetType().id() == LogicalTypeId::POINTER && target.GetType().id() == LogicalTypeId::POINTER);
		auto sdata = FlatVector::GetData<const STATE_TYPE *>(source);
		auto tdata = FlatVector::GetData<STATE_TYPE *>(target);

		for (idx_t i = 0; i < count; i++) {
			OP::template Combine<STATE_TYPE, OP>(*sdata[i], *tdata[i], aggr_input_data);
		}
	}